

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int ARKodeSetMassEpsLin(void *arkode_mem,sunrealtype eplifac)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  ARKLsMassMem arkls_mem;
  double local_18;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x657;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x200) != 0) {
      local_18 = eplifac;
      iVar1 = arkLs_AccessMassMem((ARKodeMem)arkode_mem,"ARKodeSetMassEpsLin",&arkls_mem);
      if (iVar1 != 0) {
        return iVar1;
      }
      arkls_mem->eplifac =
           (sunrealtype)
           (~-(ulong)(local_18 <= 0.0) & (ulong)local_18 |
           -(ulong)(local_18 <= 0.0) & 0x3fa999999999999a);
      return 0;
    }
    msgfmt = "time-stepping module does not support non-identity mass matrices";
    error_code = -0x30;
    iVar1 = 0x660;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetMassEpsLin",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSetMassEpsLin(void* arkode_mem, sunrealtype eplifac)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* store input and return */
  arkls_mem->eplifac = (eplifac <= ZERO) ? ARKLS_EPLIN : eplifac;

  return (ARKLS_SUCCESS);
}